

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

int run_server(sockaddr *sa,socklen_t salen,ptls_context_t *ctx,ptls_handshake_properties_t *hsprop)

{
  int iVar1;
  undefined4 local_3c;
  int local_38;
  int on;
  int conn_fd;
  int listen_fd;
  ptls_handshake_properties_t *hsprop_local;
  ptls_context_t *ctx_local;
  sockaddr *psStack_18;
  socklen_t salen_local;
  sockaddr *sa_local;
  
  local_3c = 1;
  _conn_fd = hsprop;
  hsprop_local = (ptls_handshake_properties_t *)ctx;
  ctx_local._4_4_ = salen;
  psStack_18 = sa;
  on = socket(2,1,0);
  if (on == -1) {
    perror("socket(2) failed");
  }
  else {
    iVar1 = setsockopt(on,1,2,&local_3c,4);
    if (iVar1 == 0) {
      iVar1 = bind(on,(sockaddr *)psStack_18,ctx_local._4_4_);
      if (iVar1 == 0) {
        iVar1 = listen(on,0x1000);
        if (iVar1 == 0) {
          do {
            do {
              local_38 = accept(on,(sockaddr *)0x0,(socklen_t *)0x0);
            } while (local_38 == -1);
            handle_connection(local_38,(ptls_context_t *)&hsprop_local->client,(char *)0x0,_conn_fd)
            ;
            close(local_38);
          } while( true );
        }
        perror("listen(2) failed");
      }
      else {
        perror("bind(2) failed");
      }
    }
    else {
      perror("setsockopt(SO_REUSEADDR) failed");
    }
  }
  return 1;
}

Assistant:

static int run_server(struct sockaddr *sa, socklen_t salen, ptls_context_t *ctx, ptls_handshake_properties_t *hsprop)
{
    int listen_fd, conn_fd, on = 1;

    if ((listen_fd = socket(AF_INET, SOCK_STREAM, 0)) == -1) {
        perror("socket(2) failed");
        return 1;
    }
    if (setsockopt(listen_fd, SOL_SOCKET, SO_REUSEADDR, &on, sizeof(on)) != 0) {
        perror("setsockopt(SO_REUSEADDR) failed");
        return 1;
    }
    if (bind(listen_fd, sa, salen) != 0) {
        perror("bind(2) failed");
        return 1;
    }
    if (listen(listen_fd, SOMAXCONN) != 0) {
        perror("listen(2) failed");
        return 1;
    }

    while (1) {
        if ((conn_fd = accept(listen_fd, NULL, 0)) != -1) {
            handle_connection(conn_fd, ctx, NULL, hsprop);
            close(conn_fd);
        }
    }

    return 0;
}